

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTask.h
# Opt level: O0

void __thiscall
HighsTask::
setTaskData<HighsMipSolverData::startSymmetryDetection(highs::parallel::TaskGroup_const&,std::unique_ptr<HighsMipSolverData::SymmetryDetectionData,std::default_delete<HighsMipSolverData::SymmetryDetectionData>>&)::__0>
          (HighsTask *this,anon_class_16_2_663289be_for_functor *f)

{
  anon_class_16_2_663289be_for_functor *in_RDI;
  memory_order __b;
  Callable<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsMipSolverData_cpp:390:21)>
  *this_00;
  
  this_00 = (Callable<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsMipSolverData_cpp:390:21)>
             *)&in_RDI[3].symData;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this_00->super_CallableBase)._vptr_CallableBase = (_func_int **)0x0;
  Callable<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/mip/HighsMipSolverData.cpp:390:21)>
  ::Callable(this_00,in_RDI);
  return;
}

Assistant:

void setTaskData(F&& f) {
    static_assert(sizeof(F) <= sizeof(taskData),
                  "given task type exceeds maximum size allowed for deque\n");
    static_assert(std::is_trivially_destructible<F>::value,
                  "given task type must be trivially destructible\n");
    metadata.stealer.store(0, std::memory_order_relaxed);

    new (taskData) Callable<F>(std::forward<F>(f));

    assert(static_cast<CallableBase*>(reinterpret_cast<Callable<F>*>(
               taskData)) == reinterpret_cast<CallableBase*>(taskData));
  }